

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

int AF_AActor_A_Look2(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                     VMReturn *ret,int numret)

{
  byte *pbVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  AActor *t2;
  AActor *t1;
  FState *pFVar6;
  char *__assertion;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_004005ac;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0040059c:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_004005ac:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x925,"int AF_AActor_A_Look2(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  t1 = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (t1 == (AActor *)0x0) goto LAB_00400456;
    bVar3 = DObject::IsKindOf((DObject *)t1,AActor::RegistrationInfo.MyClass);
    if (!bVar3) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_004005ac;
    }
  }
  else {
    if (t1 != (AActor *)0x0) goto LAB_0040059c;
LAB_00400456:
    t1 = (AActor *)0x0;
  }
  if (((t1->flags5).Value & 0x20000000) != 0) {
    return 0;
  }
  t1->threshold = 0;
  t2 = GC::ReadBarrier<AActor>((AActor **)&t1->LastHeard);
  if (((t2 != (AActor *)0x0) && (0 < t2->health)) && (uVar5 = (t2->flags).Value, (uVar5 & 4) != 0))
  {
    uVar2 = (t1->flags).Value;
    if (((level.flags._3_1_ & 0x20) == 0) && (((uVar5 ^ uVar2) >> 0x1b & 1) == 0)) {
      bVar3 = P_LookForPlayers(t1,(t1->flags4).Value & 0x10000,(FLookExParams *)0x0);
      if (bVar3) {
        AActor::SetState(t1,t1->SeeState,false);
        pbVar1 = (byte *)((long)&(t1->flags4).Value + 1);
        *pbVar1 = *pbVar1 | 0x80;
        return 0;
      }
    }
    else if (((uVar2 & 0x20) == 0) || (bVar3 = P_CheckSight(t1,t2,4), bVar3)) {
      (t1->target).field_0.p = t2;
      t1->threshold = 10;
      pFVar6 = t1->SeeState;
      goto LAB_00400588;
    }
  }
  iVar4 = FRandom::operator()(&pr_look2);
  if (iVar4 < 0x1e) {
    pFVar6 = t1->SpawnState;
    uVar5 = FRandom::operator()(&pr_look2);
    AActor::SetState(t1,pFVar6 + (ulong)(uVar5 & 1) + 1,false);
  }
  if (((t1->flags4).Value & 0x20000) != 0) {
    return 0;
  }
  iVar4 = FRandom::operator()(&pr_look2);
  if (0x27 < iVar4) {
    return 0;
  }
  pFVar6 = t1->SpawnState + 3;
LAB_00400588:
  AActor::SetState(t1,pFVar6,false);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Look2)
{
	PARAM_SELF_PROLOGUE(AActor);

	AActor *targ;

	if (self->flags5 & MF5_INCONVERSATION)
		return 0;

	self->threshold = 0;
	targ = self->LastHeard;

	if (targ != NULL && targ->health <= 0)
	{
		targ = NULL;
	}

	if (targ && (targ->flags & MF_SHOOTABLE))
	{
		if ((level.flags & LEVEL_NOALLIES) ||
			(self->flags & MF_FRIENDLY) != (targ->flags & MF_FRIENDLY))
		{
			if (self->flags & MF_AMBUSH)
			{
				if (!P_CheckSight (self, targ, SF_SEEPASTBLOCKEVERYTHING))
					goto nosee;
			}
			self->target = targ;
			self->threshold = 10;
			self->SetState (self->SeeState);
			return 0;
		}
		else
		{
			if (!P_LookForPlayers (self, self->flags4 & MF4_LOOKALLAROUND, NULL))
				goto nosee;
			self->SetState (self->SeeState);
			self->flags4 |= MF4_INCOMBAT;
			return 0;
		}
	}
nosee:
	if (pr_look2() < 30)
	{
		self->SetState (self->SpawnState + (pr_look2() & 1) + 1);
	}
	if (!(self->flags4 & MF4_STANDSTILL) && pr_look2() < 40)
	{
		self->SetState (self->SpawnState + 3);
	}
	return 0;
}